

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expr.cc
# Opt level: O0

void __thiscall expr_param_Test::TestBody(expr_param_Test *this)

{
  bool bVar1;
  Generator *pGVar2;
  char *pcVar3;
  AssertHelper local_b80;
  Message local_b78;
  string local_b70;
  undefined1 local_b50 [8];
  AssertionResult gtest_ar_2;
  Message local_b38;
  int64_t local_b30;
  undefined1 local_b28 [8];
  AssertionResult gtest_ar_1;
  Message local_b10;
  string local_b08;
  undefined1 local_ae8 [8];
  AssertionResult gtest_ar;
  int value;
  undefined1 local_ab0 [8];
  Param p;
  allocator<char> local_6b9;
  string local_6b8;
  undefined1 local_698 [8];
  Generator mod;
  Context c;
  expr_param_Test *this_local;
  
  kratos::Context::Context((Context *)&mod.use_stmts_remove_cache_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b8,"mod",&local_6b9);
  pGVar2 = kratos::Context::generator((Context *)&mod.use_stmts_remove_cache_,&local_6b8);
  kratos::Generator::Generator((Generator *)local_698,pGVar2);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::allocator<char>::~allocator(&local_6b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&value,"a",
             (allocator<char> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  kratos::Param::Param((Param *)local_ab0,(Generator *)local_698,(string *)&value,2,false);
  std::__cxx11::string::~string((string *)&value);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 2;
  kratos::Param::set_value((Param *)local_ab0,2);
  kratos::Param::to_string_abi_cxx11_(&local_b08,(Param *)local_ab0);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[2],_nullptr>
            ((EqHelper *)local_ae8,"p.to_string()","\"a\"",&local_b08,(char (*) [2])0x447b50);
  std::__cxx11::string::~string((string *)&local_b08);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ae8);
  if (!bVar1) {
    testing::Message::Message(&local_b10);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_ae8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0x91,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_b10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_b10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ae8);
  local_b30 = kratos::Const::value((Const *)local_ab0);
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_b28,"p.value()","value",&local_b30,(int *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b28);
  if (!bVar1) {
    testing::Message::Message(&local_b38);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0x92,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_b38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b28);
  kratos::Param::value_str_abi_cxx11_(&local_b70,(Param *)local_ab0);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[5],_nullptr>
            ((EqHelper *)local_b50,"p.value_str()","\"2\'h2\"",&local_b70,(char (*) [5])"2\'h2");
  std::__cxx11::string::~string((string *)&local_b70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b50);
  if (!bVar1) {
    testing::Message::Message(&local_b78);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b50);
    testing::internal::AssertHelper::AssertHelper
              (&local_b80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0x93,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b80,&local_b78);
    testing::internal::AssertHelper::~AssertHelper(&local_b80);
    testing::Message::~Message(&local_b78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b50);
  kratos::Param::~Param((Param *)local_ab0);
  kratos::Generator::~Generator((Generator *)local_698);
  kratos::Context::~Context((Context *)&mod.use_stmts_remove_cache_);
  return;
}

Assistant:

TEST(expr, param) {  // NOLINT
    Context c;
    auto mod = c.generator("mod");
    auto p = Param(&mod, "a", 2, false);
    auto value = 2;
    p.set_value(value);
    EXPECT_EQ(p.to_string(), "a");
    EXPECT_EQ(p.value(), value);
    EXPECT_EQ(p.value_str(), "2'h2");
}